

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void store_object_absorb(object *old,object *new)

{
  int iVar1;
  _Bool _Var2;
  uint8_t uVar3;
  int iVar4;
  object *local_18;
  
  iVar4 = (uint)new->number + (uint)old->number;
  iVar1 = old->kind->base->max_stack;
  uVar3 = (uint8_t)iVar4;
  if (iVar1 <= iVar4) {
    uVar3 = (uint8_t)iVar1;
  }
  old->number = uVar3;
  local_18 = new;
  _Var2 = tval_can_have_timeout(old);
  if (_Var2) {
    old->timeout = old->timeout + new->timeout;
  }
  _Var2 = tval_can_have_charges(old);
  if (_Var2) {
    old->pval = old->pval + new->pval;
  }
  object_origin_combine(old,new);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_18);
  return;
}

Assistant:

static void store_object_absorb(struct object *old, struct object *new)
{
	int total = old->number + new->number;

	/* Combine quantity, lose excess items */
	old->number = MIN(total, old->kind->base->max_stack);

	/* If rods are stacking, add the charging timeouts */
	if (tval_can_have_timeout(old))
		old->timeout += new->timeout;

	/* If wands/staves are stacking, combine the charges */
	if (tval_can_have_charges(old))
		old->pval += new->pval;

	object_origin_combine(old, new);

	/* Fully absorbed */
	object_delete(NULL, NULL, &new);
}